

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O2

void __thiscall jrtplib::RTPUDPv4Transmitter::~RTPUDPv4Transmitter(RTPUDPv4Transmitter *this)

{
  (this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPUDPv4Transmitter_00145070;
  Destroy(this);
  RTPAbortDescriptors::~RTPAbortDescriptors(&this->m_abortDesc);
  RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
  ::~RTPKeyHashTable(&this->acceptignoreinfo);
  std::__cxx11::_List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::
  _M_clear(&(this->rawpacketlist).
            super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>);
  RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>::
  ~RTPHashTable(&this->multicastgroups);
  RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPUDPv4Trans_GetHashIndex_IPv4Dest,_8317>
  ::~RTPHashTable(&this->destinations);
  std::__cxx11::_List_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_clear
            (&(this->localIPs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

RTPUDPv4Transmitter::~RTPUDPv4Transmitter()
{
	Destroy();
}